

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O3

void __thiscall cursespp::ListWindow::ScrollDown(ListWindow *this,int delta)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  long lVar6;
  ulong uVar7;
  long *plVar4;
  
  iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
            _vptr_IOrderable[0x42])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  lVar5 = (**(code **)(*plVar4 + 0x18))(plVar4);
  if (lVar5 != 0) {
    iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x41])(this);
    lVar5 = *(long *)CONCAT44(extraout_var_00,iVar3);
    lVar1 = ((long *)CONCAT44(extraout_var_00,iVar3))[1];
    lVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
    uVar7 = this->selectedIndex + (long)delta;
    if (lVar6 - 1U < uVar7) {
      uVar7 = lVar6 - 1U;
    }
    lVar6 = 0;
    if ((lVar5 + lVar1) - 1U <= uVar7) {
      lVar6 = (long)delta;
    }
    (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
      [0x46])(this);
    (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
      [0x44])(this,lVar6 + lVar5);
    bVar2 = IsSelectedItemCompletelyVisible(this);
    if (!bVar2) {
      lVar6 = lVar6 + lVar5;
      do {
        lVar6 = lVar6 + 1;
        (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
          _vptr_IOrderable[0x44])(this,lVar6);
        bVar2 = IsSelectedItemCompletelyVisible(this);
      } while (!bVar2);
    }
  }
  return;
}

Assistant:

void ListWindow::ScrollDown(int delta) {
    IScrollAdapter& adapter = this->GetScrollAdapter();

    if (adapter.GetEntryCount() > 0) {
        ScrollPos spos = this->GetScrollPosition();

        size_t first = spos.firstVisibleEntryIndex;
        size_t last = first + spos.visibleEntryCount;
        size_t drawIndex = first;

        size_t maxIndex = adapter.GetEntryCount() - 1;
        size_t newIndex = this->selectedIndex + delta;
        newIndex = std::min(newIndex, maxIndex);

        if (newIndex >= last - 1) {
            drawIndex = drawIndex + delta;
        }

        this->SetSelectedIndex(newIndex);

        this->ScrollTo(drawIndex);

        /* when scrolling down it's possible for the last item to be
        the selection, and partially obscured. if we hit this case, we
        just continue scrolling until the selected item is completely
        visible to the user. */
        while (!IsSelectedItemCompletelyVisible()) {
            this->ScrollTo(++drawIndex);
        }
    }
}